

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

void Commands::Inventory(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *arguments,Character *from)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  World *pWVar2;
  pointer pbVar3;
  pointer pcVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Character *this;
  mapped_type *this_00;
  _List_node_base *p_Var8;
  PacketBuilder reply;
  string name;
  string local_120;
  string local_100;
  undefined1 local_e0 [48];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pWVar2 = from->world;
  pbVar3 = (arguments->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar4 = (pbVar3->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,pcVar4 + pbVar3->_M_string_length);
  this = World::GetCharacter(pWVar2,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = local_e0 + 0x10;
  local_e0._0_8_ = pcVar4;
  if (this == (Character *)0x0) {
    pWVar2 = from->world;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"character_not_found","");
    I18N::Format<>(&local_70,&pWVar2->i18n,(string *)local_e0);
    (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_0012b5d0:
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
LAB_0012b5d8:
    local_b0._M_dataplus._M_p = (pointer)local_e0._0_8_;
    if ((pointer)local_e0._0_8_ == pcVar4) {
      return;
    }
    goto LAB_0012b9c7;
  }
  uVar5 = (**(this->super_Command_Source)._vptr_Command_Source)(this);
  pWVar2 = from->world;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"cmdprotect","");
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar2->admin_config,(key_type *)local_e0);
  iVar6 = util::variant::GetInt(this_00);
  if ((int)(uVar5 & 0xff) < iVar6) {
    if ((pointer)local_e0._0_8_ != pcVar4) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
  }
  else {
    iVar6 = (**(this->super_Command_Source)._vptr_Command_Source)(this);
    iVar7 = (**(from->super_Command_Source)._vptr_Command_Source)(from);
    if ((pointer)local_e0._0_8_ != pcVar4) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    if ((byte)iVar7 < (byte)iVar6) {
      pWVar2 = from->world;
      local_e0._0_8_ = pcVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"command_access_denied","")
      ;
      I18N::Format<>(&local_90,&pWVar2->i18n,(string *)local_e0);
      (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_90);
      local_70.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
      local_70._M_dataplus._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_0012b5d0;
      goto LAB_0012b5d8;
    }
  }
  (*(this->super_Command_Source)._vptr_Command_Source[2])((string *)local_e0,this);
  util::ucfirst(&local_b0,(string *)local_e0);
  if ((pointer)local_e0._0_8_ != pcVar4) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
  }
  PacketBuilder::PacketBuilder
            ((PacketBuilder *)local_e0,PACKET_ADMININTERACT,PACKET_LIST,
             (this->bank).super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl.
             _M_node._M_size * 7 +
             (this->inventory).super__List_base<Character_Item,_std::allocator<Character_Item>_>.
             _M_impl._M_node._M_size * 6 + local_b0._M_string_length + 0x20);
  switch(this->admin) {
  case ADMIN_GUIDE:
    pWVar2 = from->world;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"light_guide_title","");
    I18N::Format<std::__cxx11::string&>(&local_120,&pWVar2->i18n,&local_100,&local_b0);
    PacketBuilder::AddString((PacketBuilder *)local_e0,&local_120);
    break;
  case ADMIN_GUARDIAN:
    pWVar2 = from->world;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"guardian_title","");
    I18N::Format<std::__cxx11::string&>(&local_120,&pWVar2->i18n,&local_100,&local_b0);
    PacketBuilder::AddString((PacketBuilder *)local_e0,&local_120);
    break;
  case ADMIN_GM:
    pWVar2 = from->world;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"game_master_title","");
    I18N::Format<std::__cxx11::string&>(&local_120,&pWVar2->i18n,&local_100,&local_b0);
    PacketBuilder::AddString((PacketBuilder *)local_e0,&local_120);
    break;
  case ADMIN_HGM:
    pWVar2 = from->world;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"high_game_master_title","");
    I18N::Format<std::__cxx11::string&>(&local_120,&pWVar2->i18n,&local_100,&local_b0);
    PacketBuilder::AddString((PacketBuilder *)local_e0,&local_120);
    break;
  default:
    PacketBuilder::AddString((PacketBuilder *)local_e0,&local_b0);
    goto LAB_0012b830;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
LAB_0012b830:
  paVar1 = &local_120.field_2;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120," ","");
  PacketBuilder::AddString((PacketBuilder *)local_e0,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  Character::PaddedGuildTag_abi_cxx11_(&local_100,this);
  util::trim(&local_120,&local_100);
  PacketBuilder::AddBreakString((PacketBuilder *)local_e0,&local_120,0xff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  iVar6 = Character::Usage(this);
  PacketBuilder::AddInt((PacketBuilder *)local_e0,iVar6);
  PacketBuilder::AddByte((PacketBuilder *)local_e0,0xff);
  PacketBuilder::AddInt((PacketBuilder *)local_e0,this->goldbank);
  PacketBuilder::AddByte((PacketBuilder *)local_e0,0xff);
  p_Var8 = (_List_node_base *)&this->inventory;
  while (p_Var8 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)&p_Var8->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var8 != (_List_node_base *)&this->inventory) {
    iVar6 = *(int *)((long)&p_Var8[1]._M_next + 4);
    PacketBuilder::AddShort((PacketBuilder *)local_e0,(int)*(short *)&p_Var8[1]._M_next);
    PacketBuilder::AddInt((PacketBuilder *)local_e0,iVar6);
  }
  PacketBuilder::AddByte((PacketBuilder *)local_e0,0xff);
  p_Var8 = (_List_node_base *)&this->bank;
  while (p_Var8 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)&p_Var8->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var8 != (_List_node_base *)&this->bank) {
    iVar6 = *(int *)((long)&p_Var8[1]._M_next + 4);
    PacketBuilder::AddShort((PacketBuilder *)local_e0,(int)*(short *)&p_Var8[1]._M_next);
    PacketBuilder::AddThree((PacketBuilder *)local_e0,iVar6);
  }
  Character::Send(from,(PacketBuilder *)local_e0);
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_e0);
  local_e0._16_8_ = local_b0.field_2._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
    return;
  }
LAB_0012b9c7:
  operator_delete(local_b0._M_dataplus._M_p,local_e0._16_8_ + 1);
  return;
}

Assistant:

void Inventory(const std::vector<std::string>& arguments, Character* from)
{
	Character *victim = from->world->GetCharacter(arguments[0]);

	if (!victim)
	{
		from->ServerMsg(from->world->i18n.Format("character_not_found"));
	}
	else
	{
		if (victim->SourceAccess() < int(from->world->admin_config["cmdprotect"])
		 || victim->SourceAccess() <= from->SourceAccess())
		{
			std::string name = util::ucfirst(victim->SourceName());

			PacketBuilder reply(PACKET_ADMININTERACT, PACKET_LIST, 32 + name.length() + victim->inventory.size() * 6 + victim->bank.size() * 7);

			switch (victim->admin)
			{
				case ADMIN_HGM:      reply.AddString(from->world->i18n.Format("high_game_master_title", name)); break;
				case ADMIN_GM:       reply.AddString(from->world->i18n.Format("game_master_title", name)); break;
				case ADMIN_GUARDIAN: reply.AddString(from->world->i18n.Format("guardian_title", name)); break;
				case ADMIN_GUIDE:    reply.AddString(from->world->i18n.Format("light_guide_title", name)); break;
				default:             reply.AddString(name); break;
			}

			reply.AddString(" ");
			reply.AddBreakString(util::trim(victim->PaddedGuildTag()));
			reply.AddInt(victim->Usage());
			reply.AddByte(255);
			reply.AddInt(victim->goldbank);
			reply.AddByte(255);

			UTIL_FOREACH(victim->inventory, item)
			{
				reply.AddShort(item.id);
				reply.AddInt(item.amount);
			}
			reply.AddByte(255);

			UTIL_FOREACH(victim->bank, item)
			{
				reply.AddShort(item.id);
				reply.AddThree(item.amount);
			}

			from->Send(reply);
		}
		else
		{
			from->ServerMsg(from->world->i18n.Format("command_access_denied"));
		}
	}
}